

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

int xmlRelaxNGValidateDefinition(xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict define)

{
  xmlRelaxNGStatesPtr *ppxVar1;
  uint uVar2;
  xmlGenericErrorFunc p_Var3;
  xmlRelaxNGStatesPtr pxVar4;
  int iVar5;
  xmlGenericErrorFunc *pp_Var6;
  void **ppvVar7;
  xmlRelaxNGValidStatePtr *ppxVar8;
  xmlRelaxNGStatesPtr states;
  xmlRelaxNGStatesPtr pxVar9;
  long lVar10;
  ulong uVar11;
  xmlRelaxNGValidStatePtr *ppxVar12;
  long lVar13;
  uint local_54;
  
  if ((ctxt->state != (xmlRelaxNGValidStatePtr)0x0) && (ctxt->states != (xmlRelaxNGStatesPtr)0x0)) {
    pp_Var6 = __xmlGenericError();
    p_Var3 = *pp_Var6;
    ppvVar7 = __xmlGenericErrorContext();
    (*p_Var3)(*ppvVar7,"Unimplemented block at %s:%d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/relaxng.c"
              ,0x29a0);
    xmlRelaxNGFreeValidState(ctxt,ctxt->state);
    ctxt->state = (xmlRelaxNGValidStatePtr)0x0;
  }
  ppxVar1 = &ctxt->states;
  pxVar4 = ctxt->states;
  if (pxVar4 != (xmlRelaxNGStatesPtr)0x0) {
    if (pxVar4->nbState != 1) {
      ppxVar12 = &ctxt->state;
      ctxt->states = (xmlRelaxNGStatesPtr)0x0;
      uVar2 = ctxt->flags;
      ctxt->flags = uVar2 | 1;
      if (pxVar4->nbState < 1) {
        pxVar9 = (xmlRelaxNGStatesPtr)0x0;
        local_54 = 0;
      }
      else {
        lVar13 = 0;
        local_54 = 0;
        states = (xmlRelaxNGStatesPtr)0x0;
        do {
          ctxt->state = pxVar4->tabState[lVar13];
          ctxt->states = (xmlRelaxNGStatesPtr)0x0;
          iVar5 = xmlRelaxNGValidateState(ctxt,define);
          if ((ctxt->state != (xmlRelaxNGValidStatePtr)0x0) &&
             (*ppxVar1 != (xmlRelaxNGStatesPtr)0x0)) {
            pp_Var6 = __xmlGenericError();
            p_Var3 = *pp_Var6;
            ppvVar7 = __xmlGenericErrorContext();
            (*p_Var3)(*ppvVar7,"Unimplemented block at %s:%d\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/relaxng.c"
                      ,0x29c5);
            xmlRelaxNGFreeValidState(ctxt,ctxt->state);
            ctxt->state = (xmlRelaxNGValidStatePtr)0x0;
          }
          ppxVar8 = ppxVar12;
          if (iVar5 == 0) {
            pxVar9 = *ppxVar1;
            if (pxVar9 == (xmlRelaxNGStatesPtr)0x0) {
              if (states == (xmlRelaxNGStatesPtr)0x0) {
                lVar10 = (long)(int)local_54;
                local_54 = local_54 + 1;
                pxVar4->tabState[lVar10] = *ppxVar12;
                states = (xmlRelaxNGStatesPtr)0x0;
              }
              else {
                xmlRelaxNGAddStates(ctxt,states,*ppxVar12);
              }
              goto LAB_00176205;
            }
            if (states != (xmlRelaxNGStatesPtr)0x0) {
              pxVar9 = *ppxVar1;
              if (0 < pxVar9->nbState) {
                lVar10 = 0;
                do {
                  xmlRelaxNGAddStates(ctxt,states,pxVar9->tabState[lVar10]);
                  lVar10 = lVar10 + 1;
                  pxVar9 = ctxt->states;
                } while (lVar10 < pxVar9->nbState);
              }
              goto LAB_001761f5;
            }
            *ppxVar1 = (xmlRelaxNGStatesPtr)0x0;
            if (0 < (int)local_54) {
              uVar11 = 0;
              do {
                xmlRelaxNGAddStates(ctxt,pxVar9,pxVar4->tabState[uVar11]);
                uVar11 = uVar11 + 1;
              } while (local_54 != uVar11);
            }
          }
          else {
            if (*ppxVar12 == (xmlRelaxNGValidStatePtr)0x0) {
              pxVar9 = states;
              if (*ppxVar1 == (xmlRelaxNGStatesPtr)0x0) goto LAB_0017620c;
              pxVar9 = *ppxVar1;
              if (0 < pxVar9->nbState) {
                lVar10 = 0;
                do {
                  xmlRelaxNGFreeValidState(ctxt,pxVar9->tabState[lVar10]);
                  lVar10 = lVar10 + 1;
                  pxVar9 = ctxt->states;
                } while (lVar10 < pxVar9->nbState);
              }
LAB_001761f5:
              xmlRelaxNGFreeStates(ctxt,pxVar9);
              ppxVar8 = (xmlRelaxNGValidStatePtr *)ppxVar1;
            }
            else {
              xmlRelaxNGFreeValidState(ctxt,*ppxVar12);
            }
LAB_00176205:
            *ppxVar8 = (xmlRelaxNGValidStatePtr)0x0;
            pxVar9 = states;
          }
LAB_0017620c:
          lVar13 = lVar13 + 1;
          states = pxVar9;
        } while (lVar13 < pxVar4->nbState);
      }
      ctxt->flags = uVar2;
      if (pxVar9 == (xmlRelaxNGStatesPtr)0x0) {
        if (1 < (int)local_54) {
          pxVar4->nbState = local_54;
          *ppxVar1 = pxVar4;
          goto LAB_001762f8;
        }
        if (local_54 == 1) {
          ctxt->state = *pxVar4->tabState;
          xmlRelaxNGFreeStates(ctxt,pxVar4);
          goto LAB_001762f8;
        }
        xmlRelaxNGFreeStates(ctxt,pxVar4);
        iVar5 = -1;
        if (ctxt->states != (xmlRelaxNGStatesPtr)0x0) {
          xmlRelaxNGFreeStates(ctxt,ctxt->states);
          ctxt->states = (xmlRelaxNGStatesPtr)0x0;
        }
      }
      else {
        xmlRelaxNGFreeStates(ctxt,pxVar4);
        ctxt->states = pxVar9;
LAB_001762f8:
        iVar5 = 0;
      }
      if (*ppxVar12 == (xmlRelaxNGValidStatePtr)0x0) {
        return iVar5;
      }
      if (*ppxVar1 == (xmlRelaxNGStatesPtr)0x0) {
        return iVar5;
      }
      pp_Var6 = __xmlGenericError();
      p_Var3 = *pp_Var6;
      ppvVar7 = __xmlGenericErrorContext();
      (*p_Var3)(*ppvVar7,"Unimplemented block at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/relaxng.c"
                ,0x2a07);
      xmlRelaxNGFreeValidState(ctxt,ctxt->state);
      goto LAB_0017633f;
    }
    if (pxVar4 != (xmlRelaxNGStatesPtr)0x0) {
      ctxt->state = *pxVar4->tabState;
      xmlRelaxNGFreeStates(ctxt,pxVar4);
      ctxt->states = (xmlRelaxNGStatesPtr)0x0;
    }
  }
  iVar5 = xmlRelaxNGValidateState(ctxt,define);
  if ((ctxt->state != (xmlRelaxNGValidStatePtr)0x0) && (*ppxVar1 != (xmlRelaxNGStatesPtr)0x0)) {
    pp_Var6 = __xmlGenericError();
    p_Var3 = *pp_Var6;
    ppvVar7 = __xmlGenericErrorContext();
    (*p_Var3)(*ppvVar7,"Unimplemented block at %s:%d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/relaxng.c"
              ,0x29ac);
    xmlRelaxNGFreeValidState(ctxt,ctxt->state);
    ctxt->state = (xmlRelaxNGValidStatePtr)0x0;
  }
  pxVar4 = *ppxVar1;
  if (pxVar4 == (xmlRelaxNGStatesPtr)0x0) {
    return iVar5;
  }
  if (pxVar4->nbState != 1) {
    return iVar5;
  }
  ctxt->state = *pxVar4->tabState;
  xmlRelaxNGFreeStates(ctxt,pxVar4);
  ppxVar12 = (xmlRelaxNGValidStatePtr *)ppxVar1;
LAB_0017633f:
  *ppxVar12 = (xmlRelaxNGValidStatePtr)0x0;
  return iVar5;
}

Assistant:

static int
xmlRelaxNGValidateDefinition(xmlRelaxNGValidCtxtPtr ctxt,
                             xmlRelaxNGDefinePtr define)
{
    xmlRelaxNGStatesPtr states, res;
    int i, j, k, ret, oldflags;

    /*
     * We should NOT have both ctxt->state and ctxt->states
     */
    if ((ctxt->state != NULL) && (ctxt->states != NULL)) {
        TODO xmlRelaxNGFreeValidState(ctxt, ctxt->state);
        ctxt->state = NULL;
    }

    if ((ctxt->states == NULL) || (ctxt->states->nbState == 1)) {
        if (ctxt->states != NULL) {
            ctxt->state = ctxt->states->tabState[0];
            xmlRelaxNGFreeStates(ctxt, ctxt->states);
            ctxt->states = NULL;
        }
        ret = xmlRelaxNGValidateState(ctxt, define);
        if ((ctxt->state != NULL) && (ctxt->states != NULL)) {
            TODO xmlRelaxNGFreeValidState(ctxt, ctxt->state);
            ctxt->state = NULL;
        }
        if ((ctxt->states != NULL) && (ctxt->states->nbState == 1)) {
            ctxt->state = ctxt->states->tabState[0];
            xmlRelaxNGFreeStates(ctxt, ctxt->states);
            ctxt->states = NULL;
        }
        return (ret);
    }

    states = ctxt->states;
    ctxt->states = NULL;
    res = NULL;
    j = 0;
    oldflags = ctxt->flags;
    ctxt->flags |= FLAGS_IGNORABLE;
    for (i = 0; i < states->nbState; i++) {
        ctxt->state = states->tabState[i];
        ctxt->states = NULL;
        ret = xmlRelaxNGValidateState(ctxt, define);
        /*
         * We should NOT have both ctxt->state and ctxt->states
         */
        if ((ctxt->state != NULL) && (ctxt->states != NULL)) {
            TODO xmlRelaxNGFreeValidState(ctxt, ctxt->state);
            ctxt->state = NULL;
        }
        if (ret == 0) {
            if (ctxt->states == NULL) {
                if (res != NULL) {
                    /* add the state to the container */
                    xmlRelaxNGAddStates(ctxt, res, ctxt->state);
                    ctxt->state = NULL;
                } else {
                    /* add the state directly in states */
                    states->tabState[j++] = ctxt->state;
                    ctxt->state = NULL;
                }
            } else {
                if (res == NULL) {
                    /* make it the new container and copy other results */
                    res = ctxt->states;
                    ctxt->states = NULL;
                    for (k = 0; k < j; k++)
                        xmlRelaxNGAddStates(ctxt, res,
                                            states->tabState[k]);
                } else {
                    /* add all the new results to res and reff the container */
                    for (k = 0; k < ctxt->states->nbState; k++)
                        xmlRelaxNGAddStates(ctxt, res,
                                            ctxt->states->tabState[k]);
                    xmlRelaxNGFreeStates(ctxt, ctxt->states);
                    ctxt->states = NULL;
                }
            }
        } else {
            if (ctxt->state != NULL) {
                xmlRelaxNGFreeValidState(ctxt, ctxt->state);
                ctxt->state = NULL;
            } else if (ctxt->states != NULL) {
                for (k = 0; k < ctxt->states->nbState; k++)
                    xmlRelaxNGFreeValidState(ctxt,
                                             ctxt->states->tabState[k]);
                xmlRelaxNGFreeStates(ctxt, ctxt->states);
                ctxt->states = NULL;
            }
        }
    }
    ctxt->flags = oldflags;
    if (res != NULL) {
        xmlRelaxNGFreeStates(ctxt, states);
        ctxt->states = res;
        ret = 0;
    } else if (j > 1) {
        states->nbState = j;
        ctxt->states = states;
        ret = 0;
    } else if (j == 1) {
        ctxt->state = states->tabState[0];
        xmlRelaxNGFreeStates(ctxt, states);
        ret = 0;
    } else {
        ret = -1;
        xmlRelaxNGFreeStates(ctxt, states);
        if (ctxt->states != NULL) {
            xmlRelaxNGFreeStates(ctxt, ctxt->states);
            ctxt->states = NULL;
        }
    }
    if ((ctxt->state != NULL) && (ctxt->states != NULL)) {
        TODO xmlRelaxNGFreeValidState(ctxt, ctxt->state);
        ctxt->state = NULL;
    }
    return (ret);
}